

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

_Bool Curl_meets_timecondition(Curl_easy *data,time_t timeofdoc)

{
  undefined1 *puVar1;
  long lVar2;
  curl_trc_feat *pcVar3;
  char *fmt;
  
  if (timeofdoc == 0) {
    return true;
  }
  lVar2 = (data->set).timevalue;
  if (lVar2 == 0) {
    return true;
  }
  if ((data->set).timecondition == '\x02') {
    if (timeofdoc < lVar2) {
      return true;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0015bd37;
    pcVar3 = (data->state).feat;
    fmt = "The requested document is not old enough";
  }
  else {
    if (lVar2 < timeofdoc) {
      return true;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0015bd37;
    pcVar3 = (data->state).feat;
    fmt = "The requested document is not new enough";
  }
  if ((pcVar3 == (curl_trc_feat *)0x0) || (0 < pcVar3->log_level)) {
    Curl_infof(data,fmt);
  }
LAB_0015bd37:
  puVar1 = &(data->info).field_0xe4;
  *puVar1 = *puVar1 | 1;
  return false;
}

Assistant:

bool Curl_meets_timecondition(struct Curl_easy *data, time_t timeofdoc)
{
  if((timeofdoc == 0) || (data->set.timevalue == 0))
    return TRUE;

  switch(data->set.timecondition) {
  case CURL_TIMECOND_IFMODSINCE:
  default:
    if(timeofdoc <= data->set.timevalue) {
      infof(data,
            "The requested document is not new enough");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    if(timeofdoc >= data->set.timevalue) {
      infof(data,
            "The requested document is not old enough");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  }

  return TRUE;
}